

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O0

void __thiscall
iffl::
flat_forward_list<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>,_std::pmr::polymorphic_allocator<char>_>
::validate_data_invariants
          (flat_forward_list<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>,_std::pmr::polymorphic_allocator<char>_>
           *this)

{
  pointer_type pcVar1;
  iffl *this_00;
  buffer_type *pbVar2;
  buffer_char_pointer pcVar3;
  default_validate_element_fn<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>_>
  *in_R8;
  type *local_60;
  type *buffer_view;
  type *valid;
  pair<bool,_iffl::flat_forward_list_ref<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>_>_>
  local_48;
  long local_28;
  size_type last_element_offset;
  size_type buffer_length;
  size_with_padding_t last_element_size;
  flat_forward_list<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>,_std::pmr::polymorphic_allocator<char>_>
  *this_local;
  
  last_element_size.size = (size_t)this;
  pbVar2 = buff(this);
  if (pbVar2->last != (pointer_type)0x0) {
    pbVar2 = buff(this);
    buffer_length =
         (size_type)
         flat_forward_list_traits_traits<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>_>
         ::get_size(pbVar2->last);
    last_element_offset = 0;
    pbVar2 = buff(this);
    pcVar1 = pbVar2->last;
    pbVar2 = buff(this);
    last_element_offset = (size_type)(pcVar1 + (buffer_length - (long)pbVar2->begin));
    pbVar2 = buff(this);
    pcVar1 = pbVar2->last;
    pbVar2 = buff(this);
    local_28 = (long)pcVar1 - (long)pbVar2->begin;
    if (last_element_offset < local_28 + buffer_length) {
      std::terminate();
    }
    pbVar2 = buff(this);
    this_00 = (iffl *)pbVar2->begin;
    pbVar2 = buff(this);
    flat_forward_list_validate<pod_array_list_entry<char>,flat_forward_list_traits_unaligned<char>,iffl::default_validate_element_fn<pod_array_list_entry<char>,flat_forward_list_traits_unaligned<char>>>
              (&local_48,this_00,pbVar2->begin + last_element_offset,(char *)((long)&valid + 7),
               in_R8);
    buffer_view = (type *)std::
                          get<0ul,bool,iffl::flat_forward_list_ref<pod_array_list_entry<char>,flat_forward_list_traits_unaligned<char>>>
                                    (&local_48);
    local_60 = std::
               get<1ul,bool,iffl::flat_forward_list_ref<pod_array_list_entry<char>,flat_forward_list_traits_unaligned<char>>>
                         (&local_48);
    if (((ulong)(buffer_view->buffer_).begin & 1) == 0) {
      std::terminate();
    }
    flat_forward_list_ref<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>_>::
    last((flat_forward_list_ref<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>_>
          *)&stack0xffffffffffffff98);
    pcVar3 = flat_forward_list_iterator_t<const_pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>_>
             ::get_ptr((flat_forward_list_iterator_t<const_pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>_>
                        *)&stack0xffffffffffffff98);
    pbVar2 = buff(this);
    if (pcVar3 != pbVar2->last) {
      std::terminate();
    }
    std::
    pair<bool,_iffl::flat_forward_list_ref<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>_>_>
    ::~pair(&local_48);
  }
  return;
}

Assistant:

void validate_data_invariants() const noexcept {
#ifdef FFL_DBG_CHECK_DATA_VALID
        if (buff().last) {
            size_with_padding_t const last_element_size = traits_traits::get_size(buff().last);
            //
            // For element types that have offset of next element use entire buffer for validation
            // for element types that do not have offset to the next element, we have to limit 
            // by the end of the last element.
            // If there is sufficient reservation after last element then validate would not know 
            // where to stop, and might fail.
            //
            size_type buffer_length{ 0 };
            if constexpr (traits_traits::has_next_offset_v) {
                buffer_length = static_cast<size_type>(buff().end - buff().begin);
            } else {
                buffer_length = static_cast<size_type>(buff().last - buff().begin) + last_element_size.size;
            }

            size_type const last_element_offset{ static_cast<size_type>(buff().last - buff().begin) };
            FFL_CODDING_ERROR_IF(buffer_length < (last_element_offset + last_element_size.size));

            auto const [valid, buffer_view] = flat_forward_list_validate<T, TT>(buff().begin, buff().begin + buffer_length);
            FFL_CODDING_ERROR_IF_NOT(valid);
            FFL_CODDING_ERROR_IF_NOT(buffer_view.last().get_ptr() == buff().last);
        }
#endif //FFL_DBG_CHECK_DATA_VALID
    }